

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools.cxx
# Opt level: O3

void __thiscall level_tools::process(level_tools *this,cl_parser *cl)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  xr_ini_file *pxVar5;
  xr_shaders_xrlc_lib *this_00;
  char *pcVar6;
  xr_level *this_01;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  char *scene_name;
  char *rmode;
  char *local_68;
  long *local_60 [2];
  long local_50 [2];
  cl_parser *local_40;
  char *local_38;
  
  bVar2 = check_paths(this);
  if (!bVar2) {
    return;
  }
  local_38 = (char *)0x0;
  bVar2 = cl_parser::get_string(cl,"-mode",&local_38);
  pcVar7 = local_38;
  iVar4 = 1;
  if (bVar2) {
    if (((*local_38 == 'l') && (local_38[1] == 'e')) && (local_38[2] == '\0')) {
      iVar4 = 2;
    }
    else {
      iVar3 = strcmp(local_38,"le2");
      if (iVar3 == 0) {
        iVar4 = 3;
      }
      else {
        iVar3 = strcmp(pcVar7,"maya");
        if (iVar3 != 0) {
          iVar4 = strcmp(pcVar7,"raw");
          if (iVar4 != 0) {
            pcVar7 = "invalid mode";
            goto LAB_001331cc;
          }
          iVar4 = 0;
        }
      }
    }
  }
  this->m_rmode = iVar4;
  this->m_rflags = 0;
  bVar2 = cl_parser::get_bool(cl,"-with_lods");
  if (bVar2) {
    *(byte *)&this->m_rflags = (byte)this->m_rflags | 1;
  }
  bVar2 = cl_parser::get_bool(cl,"-use_mt");
  if (bVar2) {
    *(byte *)&this->m_rflags = (byte)this->m_rflags | 2;
  }
  bVar2 = cl_parser::get_bool(cl,"-dbgcfrm");
  if (bVar2) {
    *(byte *)&this->m_rflags = (byte)this->m_rflags | 4;
  }
  bVar2 = cl_parser::get_bool(cl,"-dbgmrg");
  if (bVar2) {
    *(byte *)&this->m_rflags = (byte)this->m_rflags | 8;
  }
  bVar2 = cl_parser::get_bool(cl,"-terrain");
  if (bVar2) {
    *(byte *)&this->m_rflags = (byte)this->m_rflags | 0x10;
  }
  local_68 = (char *)0x0;
  bVar2 = cl_parser::get_string(cl,"-out",&local_68);
  if (bVar2) {
    if (1 < cl->m_num_params) {
      pcVar7 = "can\'t set scene name explicitly for multiple input levels";
LAB_001331cc:
      xray_re::msg(pcVar7);
      return;
    }
    cVar1 = *local_68;
    pcVar7 = local_68;
    while (cVar1 != '\0') {
      pcVar7 = pcVar7 + 1;
      iVar4 = isalnum((int)cVar1);
      if ((cVar1 != '_') && (iVar4 == 0)) {
        pcVar7 = "invalid scene name";
        goto LAB_001331cc;
      }
      cVar1 = *pcVar7;
    }
  }
  cl_parser::get_string(cl,"-sg",&this->m_sg_val);
  pxVar5 = (xr_ini_file *)operator_new(0x18);
  (pxVar5->m_sections).
  super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pxVar5->m_sections).
  super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pxVar5->m_sections).
  super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  xray_re::xr_ini_file::load(pxVar5,"converter.ini");
  this->m_ini = pxVar5;
  if ((pxVar5->m_sections).
      super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pxVar5->m_sections).
      super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = xray_re::xr_ini_file::load(pxVar5,xray_re::PA_SDK_ROOT,"converter.ini");
    if (!bVar2) {
      pcVar7 = "converter.ini";
      goto LAB_001331bc;
    }
    pxVar5 = this->m_ini;
  }
  pcVar7 = xray_re::xr_ini_file::r_string(pxVar5,"settings","debug_texture");
  this->m_debug_texture = pcVar7;
  pcVar7 = xray_re::xr_ini_file::r_string(this->m_ini,"settings","fake_gamemtl");
  this->m_fake_gamemtl = pcVar7;
  pcVar7 = xray_re::xr_ini_file::r_string(this->m_ini,"settings","ladders_gamemtl");
  this->m_ladders_gamemtl = pcVar7;
  pcVar7 = xray_re::xr_ini_file::r_string(this->m_ini,"settings","ghost_eshader");
  this->m_ghost_eshader = pcVar7;
  this_00 = (xr_shaders_xrlc_lib *)operator_new(0x20);
  this_00->_vptr_xr_shaders_xrlc_lib = (_func_int **)&PTR__xr_shaders_xrlc_lib_0024b308;
  (this_00->m_shaders).
  super__Vector_base<xray_re::xr_shader_xrlc_*,_std::allocator<xray_re::xr_shader_xrlc_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_shaders).
  super__Vector_base<xray_re::xr_shader_xrlc_*,_std::allocator<xray_re::xr_shader_xrlc_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_shaders).
  super__Vector_base<xray_re::xr_shader_xrlc_*,_std::allocator<xray_re::xr_shader_xrlc_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_shaders_xrlc_lib = this_00;
  bVar2 = xray_re::xr_shaders_xrlc_lib::load(this_00,"$game_data$","shaders_xrlc.xr");
  if (bVar2) {
    sVar8 = cl->m_num_params;
    if (sVar8 != 0) {
      lVar9 = -0x18;
      local_40 = cl;
      do {
        pcVar7 = *(char **)((long)&local_40->m_options[local_40->m_argc].name + lVar9);
        pcVar6 = strchr(pcVar7,0x3a);
        pxVar5 = this->m_ini;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = xray_re::xr_ini_file::r_string(pxVar5,"profiles","default");
          this->m_sect_profile = pcVar6;
        }
        else {
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_60,pcVar7,pcVar6);
          pcVar7 = xray_re::xr_ini_file::r_string(pxVar5,"profiles",(char *)local_60[0]);
          this->m_sect_profile = pcVar7;
          if (local_60[0] != local_50) {
            operator_delete(local_60[0],local_50[0] + 1);
          }
          pcVar7 = pcVar6 + 1;
        }
        xray_re::msg("level name: %s",pcVar7);
        if ((xray_re::xr_file_system::instance()::instance0 == '\0') &&
           (iVar4 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0), iVar4 != 0
           )) {
          xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
          __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                       &xray_re::xr_file_system::instance::instance0,&__dso_handle);
          __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
        }
        bVar2 = xray_re::xr_ini_file::line_exist(this->m_ini,this->m_sect_profile,"$game_data$");
        if (bVar2) {
          pcVar6 = xray_re::xr_ini_file::r_string(this->m_ini,this->m_sect_profile,"$game_data$");
          xray_re::xr_file_system::update_path
                    (&xray_re::xr_file_system::instance::instance0,"$temp_game_data$",pcVar6,"");
        }
        pcVar6 = xray_re::xr_ini_file::r_string(this->m_ini,this->m_sect_profile,"$game_levels$");
        xray_re::xr_file_system::update_path
                  (&xray_re::xr_file_system::instance::instance0,"$temp_level$",pcVar6,pcVar7);
        bVar2 = xray_re::xr_ini_file::line_exist(this->m_ini,this->m_sect_profile,"settings");
        if (bVar2) {
          pcVar6 = xray_re::xr_ini_file::r_string(this->m_ini,this->m_sect_profile,"settings");
          pcVar6 = xray_re::xr_ini_file::r_string(this->m_ini,pcVar6,"ladders_gamemtl");
          if (pcVar6 != (char *)0x0) {
            this->m_ladders_gamemtl = pcVar6;
          }
        }
        this_01 = (xr_level *)operator_new(0xf8);
        xray_re::xr_level::xr_level(this_01);
        this->m_level = this_01;
        bVar2 = xray_re::xr_level::load(this_01,"$temp_game_data$","$temp_level$");
        if (bVar2) {
          reconstruct_scene(this,pcVar7,local_68);
        }
        else {
          xray_re::msg("can\'t load %s",pcVar7);
        }
        if (this->m_level != (xr_level *)0x0) {
          (*this->m_level->_vptr_xr_level[1])();
        }
        lVar9 = lVar9 + -0x18;
        sVar8 = sVar8 - 1;
      } while (sVar8 != 0);
    }
    this->m_level = (xr_level *)0x0;
    return;
  }
  pcVar7 = "shaders_xrlc.xr";
LAB_001331bc:
  xray_re::msg("can\'t load %s",pcVar7);
  return;
}

Assistant:

void level_tools::process(const cl_parser& cl)
{
	if (!check_paths())
		return;

#if 0
	{
		xr_scene* scene = new xr_scene;
		if (!scene->load(cl.parameter(0)))
			throw xr_error();
		if (!scene->save("aaaa"))
			throw xr_error();
		delete scene;
		return;
	}
#endif

	const char* rmode = 0;
	if (!cl.get_string("-mode", rmode)) {
		m_rmode = RM_MAYA;
	} else if (std::strcmp(rmode, "le") == 0) {
		m_rmode = RM_LE;
	} else if (std::strcmp(rmode, "le2") == 0) {
		m_rmode = RM_LE2;
	} else if (std::strcmp(rmode, "maya") == 0) {
		m_rmode = RM_MAYA;
	} else if (std::strcmp(rmode, "raw") == 0) {
		m_rmode = RM_RAW;
	} else {
		msg("invalid mode");
		return;
	}

	m_rflags = 0;
	if (cl.get_bool("-with_lods"))
		m_rflags |= RF_WITH_LODS;
	if (cl.get_bool("-use_mt"))
		m_rflags |= RF_USE_MT;
	if (cl.get_bool("-dbgcfrm"))
		m_rflags |= RF_DEBUG_CFORM;
	if (cl.get_bool("-dbgmrg"))
		m_rflags |= RF_DEBUG_MERGE;
	if (cl.get_bool("-terrain"))
		m_rflags |= RF_TERRAIN;

	const char* scene_name = 0;
	if (cl.get_string("-out", scene_name)) {
		if (cl.num_params() > 1) {
			msg("can't set scene name explicitly for multiple input levels");
			return;
		}
		if (!check_scene_name(scene_name)) {
			msg("invalid scene name");
			return;
		}
	}

	cl.get_string("-sg", m_sg_val);

	m_ini = new xr_ini_file(CONVERTER_INI);
	if (m_ini->empty() && !m_ini->load(PA_SDK_ROOT, CONVERTER_INI)) {
		msg("can't load %s", CONVERTER_INI);
		return;
	}
	// cache profile-independent settings
	m_debug_texture = m_ini->r_string("settings", "debug_texture");
	m_fake_gamemtl = m_ini->r_string("settings", "fake_gamemtl");
	m_ladders_gamemtl = m_ini->r_string("settings", "ladders_gamemtl");
	m_ghost_eshader = m_ini->r_string("settings", "ghost_eshader");

	m_shaders_xrlc_lib = new xr_shaders_xrlc_lib;
	if (!m_shaders_xrlc_lib->load(PA_GAME_DATA, "shaders_xrlc.xr")) {
		msg("can't load %s", "shaders_xrlc.xr");
		return;
	}

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* name = cl.param(i);
		if (const char* p = std::strchr(name, ':')) {
			m_sect_profile = m_ini->r_string("profiles", std::string(name, p - name).c_str());
			name = p + 1;
		} else {
			m_sect_profile = m_ini->r_string("profiles", "default");
		}
		msg("level name: %s", name);
		xr_file_system& fs = xr_file_system::instance();
		if (m_ini->line_exist(m_sect_profile, PA_GAME_DATA))
			fs.update_path("$temp_game_data$", m_ini->r_string(m_sect_profile, PA_GAME_DATA), "");
		fs.update_path("$temp_level$", m_ini->r_string(m_sect_profile, PA_GAME_LEVELS), name);
		
		//load system ini from build for create spawn entity correctly
		//load_system_ini("$temp_game_data$");

		//substitute settings from profile
		if (m_ini->line_exist(m_sect_profile, "settings")) {
			const char* section = m_ini->r_string(m_sect_profile, "settings");
			const char* s = m_ini->r_string(section, "ladders_gamemtl");
			if (s)
				m_ladders_gamemtl = s;
		}

		m_level = new xr_level;
		if (m_level->load("$temp_game_data$", "$temp_level$"))
			reconstruct_scene(name, scene_name);
		else
			msg("can't load %s", name);
		delete m_level;
	}
	m_level = 0;
}